

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O0

void __thiscall
BoundaryElement::cluster_particle_interact
          (BoundaryElement *this,double *potential,size_t target_node_idx,
          array<unsigned_long,_2UL> source_node_element_idxs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  value_type_conflict2 vVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  reference pvVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  int iVar27;
  long in_RDX;
  Timer *in_RDI;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double d3term;
  double d2term;
  double d1term2;
  double d1term1;
  double d1term;
  double expkr;
  double r5inv;
  double r3inv;
  double rinv;
  double r;
  double r2;
  double dz;
  double dy;
  double dx;
  size_t k;
  double pot_comp_dz;
  double pot_comp_dy;
  double pot_comp_dx;
  double pot_comp_;
  double target_z;
  double target_y;
  double target_x;
  size_t jj;
  int j3;
  int j2;
  int j1;
  double *sources_q_dz_ptr;
  double *sources_q_dy_ptr;
  double *sources_q_dx_ptr;
  double *sources_q_ptr;
  double *elements_z_ptr;
  double *elements_y_ptr;
  double *elements_x_ptr;
  double *clusters_p_dz_ptr;
  double *clusters_p_dy_ptr;
  double *clusters_p_dx_ptr;
  double *clusters_p_ptr;
  double *clusters_z_ptr;
  double *clusters_y_ptr;
  double *clusters_x_ptr;
  double kappa;
  double eps;
  size_t source_node_element_end;
  size_t source_node_element_begin;
  size_t target_cluster_potentials_begin;
  size_t target_cluster_interp_pts_begin;
  int num_potentials_per_node;
  int num_interp_pts_per_node;
  size_type in_stack_fffffffffffffe58;
  Timer *in_stack_fffffffffffffe70;
  ulong local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  int local_dc;
  int local_d8;
  int local_d4;
  
  Timer::start(in_RDI);
  sVar9 = InterpolationPoints::num_interp_pts_per_node
                    ((InterpolationPoints *)(in_RDI->end_time_).__d.__r);
  iVar27 = (int)sVar9;
  iVar6 = *(int *)&in_RDI[3].elapsed_time_.__r;
  lVar10 = in_RDX * iVar27;
  pvVar11 = std::array<unsigned_long,_2UL>::operator[]
                      ((array<unsigned_long,_2UL> *)in_RDI,in_stack_fffffffffffffe58);
  vVar7 = *pvVar11;
  pvVar11 = std::array<unsigned_long,_2UL>::operator[]
                      ((array<unsigned_long,_2UL> *)in_RDI,in_stack_fffffffffffffe58);
  uVar8 = *pvVar11;
  dVar1 = *(double *)((long)in_RDI[1].elapsed_time_.__r + 0x278);
  dVar2 = *(double *)((long)in_RDI[1].elapsed_time_.__r + 0x280);
  pdVar12 = InterpolationPoints::interp_x_ptr((InterpolationPoints *)0x12819f);
  pdVar13 = InterpolationPoints::interp_y_ptr((InterpolationPoints *)0x1281b8);
  pdVar14 = InterpolationPoints::interp_z_ptr((InterpolationPoints *)0x1281d1);
  pdVar15 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x1281ea);
  pdVar16 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x128203);
  pdVar17 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x12821c);
  pdVar18 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x128235);
  pdVar19 = Particles::x_ptr((Particles *)0x12824d);
  pdVar20 = Particles::y_ptr((Particles *)0x128265);
  pdVar21 = Particles::z_ptr((Particles *)0x12827d);
  pdVar22 = Elements::source_charge_ptr((Elements *)0x128295);
  pdVar23 = Elements::source_charge_dx_ptr((Elements *)0x1282ad);
  pdVar24 = Elements::source_charge_dy_ptr((Elements *)0x1282c5);
  pdVar25 = Elements::source_charge_dz_ptr((Elements *)0x1282dd);
  for (local_d4 = 0; local_d4 < iVar27; local_d4 = local_d4 + 1) {
    for (local_d8 = 0; local_d8 < iVar27; local_d8 = local_d8 + 1) {
      for (local_dc = 0; local_dc < iVar27; local_dc = local_dc + 1) {
        lVar26 = in_RDX * iVar6 + (long)(local_d4 * iVar27 * iVar27) + (long)(local_d8 * iVar27) +
                 (long)local_dc;
        dVar3 = pdVar12[lVar10 + local_d4];
        dVar4 = pdVar13[lVar10 + local_d8];
        dVar5 = pdVar14[lVar10 + local_dc];
        local_108 = 0.0;
        local_110 = 0.0;
        local_118 = 0.0;
        local_120 = 0.0;
        for (local_128 = vVar7; local_128 < uVar8; local_128 = local_128 + 1) {
          dVar28 = dVar3 - pdVar19[local_128];
          dVar29 = dVar4 - pdVar20[local_128];
          dVar30 = dVar5 - pdVar21[local_128];
          dVar31 = dVar30 * dVar30 + dVar28 * dVar28 + dVar29 * dVar29;
          dVar32 = sqrt(dVar31);
          dVar33 = 1.0 / dVar32;
          dVar34 = dVar33 * dVar33 * dVar33;
          dVar35 = exp(-dVar2 * dVar32);
          dVar36 = dVar34 * dVar35 * (dVar2 * dVar32 + 1.0);
          dVar37 = -dVar34 + dVar36 / dVar1;
          in_stack_fffffffffffffe70 =
               (Timer *)(dVar34 * dVar33 * dVar33 *
                        (dVar35 * (dVar2 * dVar2 * dVar31 + dVar2 * 3.0 * dVar32 + 3.0) + -3.0));
          dVar31 = dVar34 * (-dVar35 * (dVar2 * dVar32 + 1.0) + 1.0);
          local_108 = dVar33 * (1.0 - dVar35) * pdVar22[local_128] +
                      (dVar36 * dVar1 + -dVar34) *
                      (pdVar25[local_128] * dVar30 +
                      pdVar23[local_128] * dVar28 + pdVar24[local_128] * dVar29) + local_108;
          local_110 = pdVar22[local_128] * dVar37 * dVar28 +
                      -(pdVar25[local_128] * dVar28 * dVar30 * (double)in_stack_fffffffffffffe70 +
                       pdVar23[local_128] *
                       (dVar28 * dVar28 * (double)in_stack_fffffffffffffe70 + dVar31) +
                       pdVar24[local_128] * dVar28 * dVar29 * (double)in_stack_fffffffffffffe70) +
                      local_110;
          local_118 = pdVar22[local_128] * dVar37 * dVar29 +
                      -(pdVar25[local_128] * dVar29 * dVar30 * (double)in_stack_fffffffffffffe70 +
                       pdVar23[local_128] * dVar28 * dVar29 * (double)in_stack_fffffffffffffe70 +
                       pdVar24[local_128] *
                       (dVar29 * dVar29 * (double)in_stack_fffffffffffffe70 + dVar31)) + local_118;
          local_120 = pdVar22[local_128] * dVar37 * dVar30 +
                      -(pdVar25[local_128] *
                        (dVar30 * dVar30 * (double)in_stack_fffffffffffffe70 + dVar31) +
                       pdVar23[local_128] * dVar28 * dVar30 * (double)in_stack_fffffffffffffe70 +
                       pdVar24[local_128] * dVar29 * dVar30 * (double)in_stack_fffffffffffffe70) +
                      local_120;
        }
        pdVar15[lVar26] = local_108 + pdVar15[lVar26];
        pdVar16[lVar26] = local_110 + pdVar16[lVar26];
        pdVar17[lVar26] = local_118 + pdVar17[lVar26];
        pdVar18[lVar26] = local_120 + pdVar18[lVar26];
      }
    }
  }
  Timer::stop(in_stack_fffffffffffffe70);
  return;
}

Assistant:

void BoundaryElement::cluster_particle_interact(double* __restrict potential,
                                         std::size_t target_node_idx,
                                         std::array<std::size_t, 2> source_node_element_idxs)
{
    timers_.cluster_particle_interact.start();

    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    int num_potentials_per_node = num_charges_per_node_;
    
    std::size_t target_cluster_interp_pts_begin = target_node_idx * num_interp_pts_per_node;
    std::size_t target_cluster_potentials_begin = target_node_idx * num_potentials_per_node;

    std::size_t source_node_element_begin       = source_node_element_idxs[0];
    std::size_t source_node_element_end         = source_node_element_idxs[1];
    
    double eps    = params_.phys_eps_;
    double kappa  = params_.phys_kappa_;
    
    const double* __restrict clusters_x_ptr    = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr    = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr    = interp_pts_.interp_z_ptr();
    
    double* __restrict clusters_p_ptr          = interp_potential_.data();
    double* __restrict clusters_p_dx_ptr       = interp_potential_dx_.data();
    double* __restrict clusters_p_dy_ptr       = interp_potential_dy_.data();
    double* __restrict clusters_p_dz_ptr       = interp_potential_dz_.data();
    
    const double* __restrict elements_x_ptr    = elements_.x_ptr();
    const double* __restrict elements_y_ptr    = elements_.y_ptr();
    const double* __restrict elements_z_ptr    = elements_.z_ptr();
    
    const double* __restrict sources_q_ptr     = elements_.source_charge_ptr();
    const double* __restrict sources_q_dx_ptr  = elements_.source_charge_dx_ptr();
    const double* __restrict sources_q_dy_ptr  = elements_.source_charge_dy_ptr();
    const double* __restrict sources_q_dz_ptr  = elements_.source_charge_dz_ptr();
    
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop collapse(3) async(stream_id) present(clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                    clusters_p_ptr, clusters_p_dx_ptr, clusters_p_dy_ptr, clusters_p_dz_ptr, \
                    elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                    sources_q_ptr, sources_q_dx_ptr, sources_q_dy_ptr, sources_q_dz_ptr, \
                    potential)
#endif
    for (int j1 = 0; j1 < num_interp_pts_per_node; ++j1) {
    for (int j2 = 0; j2 < num_interp_pts_per_node; ++j2) {
    for (int j3 = 0; j3 < num_interp_pts_per_node; ++j3) {
    
        std::size_t jj = target_cluster_potentials_begin
                       + j1 * num_interp_pts_per_node * num_interp_pts_per_node
                       + j2 * num_interp_pts_per_node + j3;

        double target_x = clusters_x_ptr[target_cluster_interp_pts_begin + j1];
        double target_y = clusters_y_ptr[target_cluster_interp_pts_begin + j2];
        double target_z = clusters_z_ptr[target_cluster_interp_pts_begin + j3];
        
        double pot_comp_   = 0.;
        double pot_comp_dx = 0.;
        double pot_comp_dy = 0.;
        double pot_comp_dz = 0.;
    
#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_comp_,   pot_comp_dx, \
                                     pot_comp_dy, pot_comp_dz)
#endif
        for (std::size_t k = source_node_element_begin; k < source_node_element_end; ++k) {

            double dx = target_x - elements_x_ptr[k];
            double dy = target_y - elements_y_ptr[k];
            double dz = target_z - elements_z_ptr[k];

            double r2    = dx*dx + dy*dy + dz*dz;
            double r     = std::sqrt(r2);
            double rinv  = 1. / r;
            double r3inv = rinv  * rinv * rinv;
            double r5inv = r3inv * rinv * rinv;

            double expkr   =  std::exp(-kappa * r);
            double d1term  =  r3inv * expkr * (1. + (kappa * r));
            double d1term1 = -r3inv + d1term * eps;
            double d1term2 = -r3inv + d1term / eps;
            double d2term  =  r5inv * (-3. + expkr * (3. + (3. * kappa * r)
                                                   + (kappa * kappa * r2)));
            double d3term  =  r3inv * ( 1. - expkr * (1. + kappa * r));

            pot_comp_    += (rinv * (1. - expkr) * (sources_q_ptr   [k])
                                      + d1term1 * (sources_q_dx_ptr[k] * dx
                                                 + sources_q_dy_ptr[k] * dy
                                                 + sources_q_dz_ptr[k] * dz));
                                    
            pot_comp_dx  += (sources_q_ptr   [k]  * (d1term2 * dx)
                          - (sources_q_dx_ptr[k]  * (dx * dx * d2term + d3term)
                          +  sources_q_dy_ptr[k]  * (dx * dy * d2term)
                          +  sources_q_dz_ptr[k]  * (dx * dz * d2term)));
                         
            pot_comp_dy  += (sources_q_ptr   [k]  *  d1term2 * dy
                          - (sources_q_dx_ptr[k]  * (dx * dy * d2term)
                          +  sources_q_dy_ptr[k]  * (dy * dy * d2term + d3term)
                          +  sources_q_dz_ptr[k]  * (dy * dz * d2term)));
                         
            pot_comp_dz  += (sources_q_ptr   [k]  *  d1term2 * dz
                          - (sources_q_dx_ptr[k]  * (dx * dz * d2term)
                          +  sources_q_dy_ptr[k]  * (dy * dz * d2term)
                          +  sources_q_dz_ptr[k]  * (dz * dz * d2term + d3term)));
        }
    
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_ptr   [jj] += pot_comp_;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dx_ptr[jj] += pot_comp_dx;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dy_ptr[jj] += pot_comp_dy;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dz_ptr[jj] += pot_comp_dz;
    }
    }
    }

    timers_.cluster_particle_interact.stop();
}